

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void Update2Pixels_SSE2(__m128i *pi,__m128i *qi,__m128i *a0_lo,__m128i *a0_hi)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i sign_bit;
  __m128i delta;
  __m128i a1_hi;
  __m128i a1_lo;
  __m128i *a0_hi_local;
  __m128i *a0_lo_local;
  __m128i *qi_local;
  __m128i *pi_local;
  
  auVar2 = psraw((undefined1  [16])*a0_lo,ZEXT416(7));
  auVar3 = psraw((undefined1  [16])*a0_hi,ZEXT416(7));
  auVar2 = packsswb(auVar2,auVar3);
  alVar4 = (__m128i)paddsb((undefined1  [16])*pi,auVar2);
  *pi = alVar4;
  alVar4 = (__m128i)psubsb((undefined1  [16])*qi,auVar2);
  *qi = alVar4;
  uVar1 = (*pi)[1];
  (*pi)[0] = (*pi)[0] ^ 0x8080808080808080;
  (*pi)[1] = uVar1 ^ 0x8080808080808080;
  uVar1 = (*qi)[1];
  (*qi)[0] = (*qi)[0] ^ 0x8080808080808080;
  (*qi)[1] = uVar1 ^ 0x8080808080808080;
  return;
}

Assistant:

static WEBP_INLINE void Update2Pixels_SSE2(__m128i* const pi, __m128i* const qi,
                                           const __m128i* const a0_lo,
                                           const __m128i* const a0_hi) {
  const __m128i a1_lo = _mm_srai_epi16(*a0_lo, 7);
  const __m128i a1_hi = _mm_srai_epi16(*a0_hi, 7);
  const __m128i delta = _mm_packs_epi16(a1_lo, a1_hi);
  const __m128i sign_bit = _mm_set1_epi8((char)0x80);
  *pi = _mm_adds_epi8(*pi, delta);
  *qi = _mm_subs_epi8(*qi, delta);
  FLIP_SIGN_BIT2(*pi, *qi);
}